

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O1

void __thiscall
XmlModelSerialiserPrivate::writeXmlElement
          (XmlModelSerialiserPrivate *this,QXmlStreamWriter *destination,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  QModelIndex *pQVar6;
  QVariant roleData;
  QString roleString;
  int local_ac;
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  QAbstractItemModel *local_98;
  undefined8 local_90;
  int local_84;
  QString local_80;
  QString local_68;
  QModelIndex *local_50;
  QArrayData *local_48 [3];
  
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_constModel;
  iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_constModel;
  local_50 = parent;
  iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,parent);
  if (iVar4 + iVar3 != 0) {
    local_a8 = (QArrayData *)0x0;
    pcStack_a0 = L"Element";
    local_98 = (QAbstractItemModel *)0x7;
    QXmlStreamWriter::writeStartElement((QString *)destination);
    pQVar6 = local_50;
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,8);
      }
    }
    local_a8 = (QArrayData *)0x0;
    pcStack_a0 = L"RowCount";
    local_98 = (QAbstractItemModel *)0x8;
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_constModel;
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,pQVar6);
    QString::number((int)&local_68,iVar3);
    QXmlStreamWriter::writeAttribute((QString *)destination,(QString *)&local_a8);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,8);
      }
    }
    local_a8 = (QArrayData *)0x0;
    pcStack_a0 = L"ColumnCount";
    local_98 = (QAbstractItemModel *)0xb;
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_constModel;
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,pQVar6);
    QString::number((int)&local_68,iVar3);
    QXmlStreamWriter::writeAttribute((QString *)destination,(QString *)&local_a8);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,8);
      }
    }
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_constModel;
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,pQVar6);
    if (0 < iVar3) {
      local_ac = 0;
      do {
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,pQVar6);
        if (0 < iVar3) {
          local_84 = 0;
          do {
            local_a8 = (QArrayData *)0x0;
            pcStack_a0 = L"Cell";
            local_98 = (QAbstractItemModel *)0x4;
            QXmlStreamWriter::writeStartElement((QString *)destination);
            if (local_a8 != (QArrayData *)0x0) {
              LOCK();
              (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a8,2,8);
              }
            }
            local_a8 = (QArrayData *)0x0;
            pcStack_a0 = L"Row";
            local_98 = (QAbstractItemModel *)0x3;
            QXmlStreamWriter::writeStartElement((QString *)destination);
            if (local_a8 != (QArrayData *)0x0) {
              LOCK();
              (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a8,2,8);
              }
            }
            iVar3 = (int)(QModelIndex *)&local_a8;
            QString::number(iVar3,local_ac);
            QXmlStreamWriter::writeCharacters((QString *)destination);
            if (local_a8 != (QArrayData *)0x0) {
              LOCK();
              (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a8,2,8);
              }
            }
            QXmlStreamWriter::writeEndElement();
            local_a8 = (QArrayData *)0x0;
            pcStack_a0 = L"Column";
            local_98 = (QAbstractItemModel *)0x6;
            QXmlStreamWriter::writeStartElement((QString *)destination);
            if (local_a8 != (QArrayData *)0x0) {
              LOCK();
              (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a8,2,8);
              }
            }
            QString::number(iVar3,local_84);
            QXmlStreamWriter::writeCharacters((QString *)destination);
            if (local_a8 != (QArrayData *)0x0) {
              LOCK();
              (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a8,2,8);
              }
            }
            QXmlStreamWriter::writeEndElement();
            if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                m_rolesToSave.d.size != 0) {
              piVar5 = (this->super_AbstractStringSerialiserPrivate).
                       super_AbstractModelSerialiserPrivate.m_rolesToSave.d.ptr;
              do {
                pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                         super_AbstractModelSerialiserPrivate.m_constModel;
                (**(code **)(*(long *)pQVar1 + 0x60))(&local_68,pQVar1,local_ac,local_84,local_50);
                if ((long *)local_68.d.size == (long *)0x0) {
                  local_a8 = (QArrayData *)0x0;
                  pcStack_a0 = (char16_t *)0x0;
                  local_98 = (QAbstractItemModel *)0x0;
                  local_90 = 2;
                }
                else {
                  (**(code **)(*(long *)local_68.d.size + 0x90))
                            ((QModelIndex *)&local_a8,local_68.d.size,&local_68,*piVar5);
                }
                cVar2 = ::QVariant::isNull();
                if (cVar2 == '\0') {
                  AbstractStringSerialiserPrivate::saveVariant
                            (&local_68,&this->super_AbstractStringSerialiserPrivate,
                             (QVariant *)&local_a8);
                  if ((long *)local_68.d.size != (long *)0x0) {
                    local_80.d.d = (Data *)0x0;
                    local_80.d.ptr = L"DataPoint";
                    local_80.d.size = 9;
                    QXmlStreamWriter::writeStartElement((QString *)destination);
                    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_80.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
                      }
                    }
                    local_80.d.d = (Data *)0x0;
                    local_80.d.ptr = L"Role";
                    local_80.d.size = 4;
                    QString::number((int)local_48,*piVar5);
                    QXmlStreamWriter::writeAttribute((QString *)destination,&local_80);
                    if (local_48[0] != (QArrayData *)0x0) {
                      LOCK();
                      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_48[0],2,8);
                      }
                    }
                    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_80.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
                      }
                    }
                    local_80.d.d = (Data *)0x0;
                    local_80.d.ptr = L"Type";
                    local_80.d.size = 4;
                    iVar3 = ::QVariant::typeId((QVariant *)&local_a8);
                    QString::number((int)local_48,iVar3);
                    QXmlStreamWriter::writeAttribute((QString *)destination,&local_80);
                    if (local_48[0] != (QArrayData *)0x0) {
                      LOCK();
                      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_48[0],2,8);
                      }
                    }
                    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_80.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
                      }
                    }
                    QXmlStreamWriter::writeCharacters((QString *)destination);
                    QXmlStreamWriter::writeEndElement();
                  }
                  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
                    }
                  }
                }
                ::QVariant::~QVariant((QVariant *)&local_a8);
                piVar5 = piVar5 + 1;
              } while (piVar5 != (this->super_AbstractStringSerialiserPrivate).
                                 super_AbstractModelSerialiserPrivate.m_rolesToSave.d.ptr +
                                 (this->super_AbstractStringSerialiserPrivate).
                                 super_AbstractModelSerialiserPrivate.m_rolesToSave.d.size);
            }
            pQVar6 = local_50;
            iVar3 = local_84;
            pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                     super_AbstractModelSerialiserPrivate.m_constModel;
            (**(code **)(*(long *)pQVar1 + 0x60))
                      ((QModelIndex *)&local_a8,pQVar1,local_ac,local_84,local_50);
            cVar2 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,(QModelIndex *)&local_a8);
            if (cVar2 != '\0') {
              pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                       super_AbstractModelSerialiserPrivate.m_constModel;
              (**(code **)(*(long *)pQVar1 + 0x60))
                        ((QModelIndex *)&local_a8,pQVar1,local_ac,iVar3,pQVar6);
              writeXmlElement(this,destination,(QModelIndex *)&local_a8);
            }
            QXmlStreamWriter::writeEndElement();
            iVar3 = iVar3 + 1;
            pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                     super_AbstractModelSerialiserPrivate.m_constModel;
            iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,pQVar6);
            local_84 = iVar3;
          } while (iVar3 < iVar4);
        }
        local_ac = local_ac + 1;
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,pQVar6);
      } while (local_ac < iVar3);
    }
    QXmlStreamWriter::writeEndElement();
  }
  return;
}

Assistant:

void XmlModelSerialiserPrivate::writeXmlElement(QXmlStreamWriter &destination, const QModelIndex &parent) const
{
    Q_ASSERT(m_constModel);
    if (m_constModel->rowCount(parent) + m_constModel->columnCount(parent) == 0)
        return;
    destination.writeStartElement(QStringLiteral("Element"));
    destination.writeAttribute(QStringLiteral("RowCount"), QString::number(m_constModel->rowCount(parent)));
    destination.writeAttribute(QStringLiteral("ColumnCount"), QString::number(m_constModel->columnCount(parent)));
    for (int i = 0; i < m_constModel->rowCount(parent); ++i) {
        for (int j = 0; j < m_constModel->columnCount(parent); ++j) {
            destination.writeStartElement(QStringLiteral("Cell"));
            destination.writeStartElement(QStringLiteral("Row"));
            destination.writeCharacters(QString::number(i));
            destination.writeEndElement(); // Row
            destination.writeStartElement(QStringLiteral("Column"));
            destination.writeCharacters(QString::number(j));
            destination.writeEndElement(); // Column
            for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
                const QVariant roleData = m_constModel->index(i, j, parent).data(*singleRole);
                if (roleData.isNull())
                    continue; // Skip empty roles
                const QString roleString = saveVariant(roleData);
                if (roleString.isEmpty())
                    continue; // Skip unhandled types
                destination.writeStartElement(QStringLiteral("DataPoint"));
                destination.writeAttribute(QStringLiteral("Role"), QString::number(*singleRole));
                destination.writeAttribute(QStringLiteral("Type"), QString::number(roleData.userType()));
                destination.writeCharacters(roleString);
                destination.writeEndElement(); // DataPoint
            }
            if (m_constModel->hasChildren(m_constModel->index(i, j, parent))) {
                writeXmlElement(destination, m_constModel->index(i, j, parent));
            }
            destination.writeEndElement(); // Cell
        }
    }
    destination.writeEndElement(); // Element
}